

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.cpp
# Opt level: O3

Expr * hsql::Expr::makeFunctionRef
                 (char *func_name,vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *exprList,
                 bool distinct)

{
  Expr *pEVar1;
  
  pEVar1 = (Expr *)operator_new(0x60);
  pEVar1->type = kExprFunctionRef;
  pEVar1->name = (char *)0x0;
  pEVar1->table = (char *)0x0;
  pEVar1->exprList = (vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_> *)0x0;
  pEVar1->select = (SelectStatement *)0x0;
  pEVar1->expr = (Expr *)0x0;
  pEVar1->expr2 = (Expr *)0x0;
  pEVar1->alias = (char *)0x0;
  pEVar1->name = func_name;
  pEVar1->exprList = exprList;
  pEVar1->distinct = distinct;
  return pEVar1;
}

Assistant:

Expr* Expr::makeFunctionRef(char* func_name, std::vector<Expr*>* exprList, bool distinct) {
    Expr* e = new Expr(kExprFunctionRef);
    e->name = func_name;
    e->exprList = exprList;
    e->distinct = distinct;
    return e;
  }